

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_UdevEnumerate.h
# Opt level: O2

bool __thiscall axl::sys::lnx::UdevEnumerate::create(UdevEnumerate *this,udev *ctx)

{
  bool bVar1;
  udev_enumerate *puVar2;
  
  puVar2 = (udev_enumerate *)(*(code *)libudev::udev_enumerate_new)(ctx);
  if ((this->
      super_Handle<axl::sys::lnx::libudev::udev_enumerate_*,_axl::sys::lnx::UnrefUdevEnumerate,_axl::sl::Zero<axl::sys::lnx::libudev::udev_enumerate_*>_>
      ).m_h != (udev_enumerate *)0x0) {
    (*(code *)libudev::udev_enumerate_unref)();
  }
  (this->
  super_Handle<axl::sys::lnx::libudev::udev_enumerate_*,_axl::sys::lnx::UnrefUdevEnumerate,_axl::sl::Zero<axl::sys::lnx::libudev::udev_enumerate_*>_>
  ).m_h = puVar2;
  if (puVar2 != (udev_enumerate *)0x0) {
    return true;
  }
  bVar1 = failWithUdevError("udev_enumerate_new");
  return bVar1;
}

Assistant:

bool
	create(udev* ctx) {
		attach(udev_enumerate_new(ctx));
		return completeUdev(m_h, "udev_enumerate_new");
	}